

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall amrex::BaseFab<unsigned_int>::prefetchToDevice(BaseFab<unsigned_int> *this)

{
  BaseFab<unsigned_int> *this_local;
  
  return;
}

Assistant:

void
BaseFab<T>::prefetchToDevice () const noexcept
{
#ifdef AMREX_USE_GPU
    if (this->arena()->isManaged()) {
#if defined(AMREX_USE_DPCPP)
        std::size_t s = sizeof(T)*this->nvar*this->domain.numPts();
        auto& q = Gpu::Device::streamQueue();
        q.submit([&] (sycl::handler& h) { h.prefetch(this->dptr, s); });
#elif defined(AMREX_USE_CUDA) && !defined(_WIN32)
        if (Gpu::Device::devicePropMajor() >= 6) {
            std::size_t s = sizeof(T)*this->nvar*this->domain.numPts();
            AMREX_CUDA_SAFE_CALL(cudaMemPrefetchAsync(this->dptr, s,
                                                      Gpu::Device::deviceId(),
                                                      Gpu::gpuStream()));
        }
#elif defined(AMREX_USE_HIP)
        // xxxxx HIP FIX HERE after managed memory is supported
#endif
    }
#endif
}